

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
               (DataStream *s,CompactSizeWriter *args,Span<const_unsigned_char> *args_1)

{
  long in_FS_OFFSET;
  SizeComputer sizecomp;
  SizeComputer local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.nSize = 0;
  SerializeMany<SizeComputer,CompactSizeWriter,Span<unsigned_char_const>>(&local_30,args,args_1);
  WriteCompactSize<DataStream>(s,local_30.nSize);
  SerializeMany<DataStream,CompactSizeWriter,Span<unsigned_char_const>>(s,args,args_1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeToVector(Stream& s, const X&... args)
{
    SizeComputer sizecomp;
    SerializeMany(sizecomp, args...);
    WriteCompactSize(s, sizecomp.size());
    SerializeMany(s, args...);
}